

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crange.h
# Opt level: O1

complex<double> CRange::hyperg<double>(complex<double> *a,complex<double> *b,complex<double> *z)

{
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 uVar1;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  double dVar3;
  complex<double> cVar4;
  undefined1 local_98 [16];
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double dStack_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  
  local_50 = 1.0;
  local_48 = 0.0;
  local_58 = 0.0;
  local_40 = 1.0;
  local_38 = 0.0;
  do {
    local_58 = local_58 + 1.0;
    dVar3 = *(double *)(a->_M_value + 8) + 0.0;
    local_98._0_8_ =
         __divdc3(SUB84(*(double *)a->_M_value + local_58 + -1.0,0),dVar3,
                  local_58 + -1.0 + *(double *)b->_M_value,*(double *)(b->_M_value + 8) + 0.0);
    local_68 = local_50;
    dStack_60 = local_48;
    local_98._8_8_ = dVar3;
    std::complex<double>::operator*=((complex<double> *)&local_68,(complex<double> *)local_98);
    local_88 = *(double *)z->_M_value / local_58;
    local_80 = *(double *)(z->_M_value + 8) / local_58;
    std::complex<double>::operator*=((complex<double> *)&local_68,(complex<double> *)&local_88);
    local_40 = local_40 + local_68;
    local_38 = local_38 + dStack_60;
    local_78 = local_68;
    local_70 = dStack_60;
    dVar3 = cabs(local_68);
    uVar1 = extraout_RAX;
    uVar2 = extraout_RDX;
    if (dVar3 <= 1e-06) break;
    dVar3 = cabs(local_50);
    local_50 = local_78;
    local_48 = local_70;
    uVar1 = extraout_RAX_00;
    uVar2 = extraout_RDX_00;
  } while (1e-06 < dVar3);
  cVar4._M_value._8_8_ = uVar2;
  cVar4._M_value._0_8_ = uVar1;
  return (complex<double>)cVar4._M_value;
}

Assistant:

std::complex<T> hyperg(const std::complex<T> &a,
                                                const std::complex<T> &b,
                                                const std::complex<T> &z)
    {
        T dm = 0.0;
        std::complex<T> term(1.0, 0.0);
        std::complex<T> sumterm(1.0, 0.0);
        std::complex<T> previousterm;
        do {
            previousterm = term;
            dm += 1.0;
            std::complex<T> Cm(dm-1.0, 0.0);
            term = previousterm * ((a + Cm)/(b + Cm)) * (z/dm);
            sumterm += term;
        } while( std::abs(term) > 1.0e-6 && std::abs(previousterm) > 1.0e-6 );
        return(sumterm);
    }